

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool arena_decay_impl(tsdn_t *tsdn,arena_t *arena,arena_decay_t *decay,extents_t *extents,
                      _Bool is_background_thread,_Bool all)

{
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  extents_t *in_RCX;
  arena_t *in_RDX;
  arena_t *in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  size_t in_stack_00000010;
  size_t npages_new;
  _Bool epoch_advanced;
  _Bool result;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  tsdn_t *in_stack_ffffffffffffff60;
  tsdn_t *in_stack_ffffffffffffff68;
  extents_t *extents_00;
  undefined1 all_00;
  tsdn_t *in_stack_ffffffffffffffb8;
  undefined5 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc5;
  arena_t *paVar4;
  _Bool local_16;
  undefined1 is_background_thread_00;
  
  bVar3 = (byte)in_R8D & 1;
  bVar1 = in_R9B & 1;
  if (bVar1 == 0) {
    _Var2 = malloc_mutex_trylock
                      (in_stack_ffffffffffffff60,
                       (malloc_mutex_t *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (_Var2) {
      local_16 = true;
    }
    else {
      bVar1 = arena_maybe_decay((tsdn_t *)in_RSI,in_RDX,(arena_decay_t *)in_RCX,
                                (extents_t *)
                                CONCAT17(bVar3,CONCAT16(bVar1,CONCAT15(in_stack_ffffffffffffffc5,
                                                                       in_stack_ffffffffffffffc0))),
                                SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
      if ((bool)bVar1) {
        in_stack_ffffffffffffffb8 = (tsdn_t *)(in_RDX->stats).lstats[0x14].curlextents;
      }
      malloc_mutex_unlock(in_stack_ffffffffffffff60,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if ((((background_thread_enabled_state.repr & 1U) != 0) && ((bVar1 & 1) != 0)) &&
         ((bVar3 & 1) == 0)) {
        func_0x0010e7b0(in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffb8);
      }
      local_16 = false;
    }
  }
  else {
    extents_00 = in_RCX;
    paVar4 = in_RDX;
    malloc_mutex_lock(in_stack_ffffffffffffff68,(malloc_mutex_t *)in_stack_ffffffffffffff60);
    is_background_thread_00 = (undefined1)((ulong)paVar4 >> 0x38);
    all_00 = (undefined1)((uint)in_R8D >> 0x18);
    extents_npages_get(extents_00);
    arena_decay_to_limit
              (in_stack_ffffffffffffffb8,in_RSI,(arena_decay_t *)in_RDX,in_RCX,(_Bool)all_00,
               (size_t)extents_00,in_stack_00000010,(_Bool)is_background_thread_00);
    malloc_mutex_unlock(in_stack_ffffffffffffff60,
                        (malloc_mutex_t *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_16 = false;
  }
  return local_16;
}

Assistant:

static bool
arena_decay_impl(tsdn_t *tsdn, arena_t *arena, arena_decay_t *decay,
    extents_t *extents, bool is_background_thread, bool all) {
	if (all) {
		malloc_mutex_lock(tsdn, &decay->mtx);
		arena_decay_to_limit(tsdn, arena, decay, extents, all, 0,
		    extents_npages_get(extents), is_background_thread);
		malloc_mutex_unlock(tsdn, &decay->mtx);

		return false;
	}

	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* No need to wait if another thread is in progress. */
		return true;
	}

	bool epoch_advanced = arena_maybe_decay(tsdn, arena, decay, extents,
	    is_background_thread);
	size_t npages_new;
	if (epoch_advanced) {
		/* Backlog is updated on epoch advance. */
		npages_new = decay->backlog[SMOOTHSTEP_NSTEPS-1];
	}
	malloc_mutex_unlock(tsdn, &decay->mtx);

	if (have_background_thread && background_thread_enabled() &&
	    epoch_advanced && !is_background_thread) {
		background_thread_interval_check(tsdn, arena, decay,
		    npages_new);
	}

	return false;
}